

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

int memory_tree_ns::random_sample_example_pop(memory_tree *b,uint32_t *cn)

{
  uint *puVar1;
  uint uVar2;
  node *pnVar3;
  uint32_t *puVar4;
  ostream *poVar5;
  uint32_t index;
  ulong uVar6;
  v_array<unsigned_int> *array;
  float fVar7;
  
  uVar2 = 0;
  do {
    *cn = uVar2;
    uVar6 = (ulong)uVar2;
    pnVar3 = (b->nodes)._begin;
    if (pnVar3[uVar6].internal != 1) {
      if (pnVar3[uVar6].examples_index._end == pnVar3[uVar6].examples_index._begin) {
        uVar2 = 0xffffffff;
      }
      else {
        fVar7 = merand48(&b->all->random_state);
        pnVar3 = (b->nodes)._begin;
        array = &pnVar3[*cn].examples_index;
        puVar1 = array->_begin;
        index = (uint32_t)
                (fVar7 * (float)(ulong)((long)pnVar3[*cn].examples_index._end - (long)puVar1 >> 2));
        uVar2 = puVar1[(int)index];
        remove_at_index<unsigned_int>(array,index);
      }
      return uVar2;
    }
    if (1.0 <= pnVar3[uVar6].nl) {
      if (1.0 <= pnVar3[uVar6].nr) {
        if ((pnVar3[uVar6].nl < 1.0) || (pnVar3[uVar6].nr < 1.0)) {
          poVar5 = (ostream *)std::ostream::operator<<(&std::cout,uVar2);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(b->nodes)._begin[*cn].nl);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(b->nodes)._begin[*cn].nr);
          std::endl<char,std::char_traits<char>>(poVar5);
          std::operator<<((ostream *)&std::cout,"Error:  nl = 0, and nr = 0, exit...");
          exit(0);
        }
        fVar7 = merand48(&b->all->random_state);
        uVar6 = (ulong)*cn;
        pnVar3 = (b->nodes)._begin;
        if (pnVar3[uVar6].nl / (pnVar3[uVar6].nr + pnVar3[uVar6].nl) <= (double)fVar7)
        goto LAB_001bcb69;
      }
      pnVar3[uVar6].nl = pnVar3[uVar6].nl + -1.0;
      puVar4 = &(b->nodes)._begin[*cn].left;
    }
    else {
LAB_001bcb69:
      pnVar3[uVar6].nr = pnVar3[uVar6].nr + -1.0;
      puVar4 = &(b->nodes)._begin[*cn].right;
    }
    uVar2 = *puVar4;
  } while( true );
}

Assistant:

inline int random_sample_example_pop(memory_tree& b, uint32_t& cn)
    {
        cn = 0; //always start from the root:
        while (b.nodes[cn].internal == 1)
        {
            float pred = 0.;   //deal with some edge cases:
            if (b.nodes[cn].nl < 1) //no examples routed to left ever:
                pred = 1.f; //go right.
            else if (b.nodes[cn].nr < 1) //no examples routed to right ever:
                pred = -1.f; //go left.
            else if ((b.nodes[cn].nl >= 1) && (b.nodes[cn].nr >= 1))
                pred = merand48(b.all->random_state) < (b.nodes[cn].nl*1./(b.nodes[cn].nr+b.nodes[cn].nl)) ? -1.f : 1.f;
            else{
                cout<<cn<<" "<<b.nodes[cn].nl<<" "<<b.nodes[cn].nr<<endl;
                cout<<"Error:  nl = 0, and nr = 0, exit...";
                exit(0);
            }
            
            if (pred < 0){
                b.nodes[cn].nl--;
                cn = b.nodes[cn].left; 
            }
            else{
                b.nodes[cn].nr--;
                cn = b.nodes[cn].right;
            }
        }

        if (b.nodes[cn].examples_index.size() >= 1){
            int loc_at_leaf = int(merand48(b.all->random_state)*b.nodes[cn].examples_index.size());
	        uint32_t ec_id = b.nodes[cn].examples_index[loc_at_leaf];
            remove_at_index(b.nodes[cn].examples_index, loc_at_leaf); 
            return ec_id;
        }
        else    
            return -1;
    }